

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::VerifyUTF8Fallback
          (EpsCopyInputStream *this,char *ptr,size_t size)

{
  bool bVar1;
  int s;
  char *pcVar2;
  char *pcVar3;
  uint s_00;
  char *pcVar5;
  LeftoverBuffer leftover;
  anon_class_8_1_4e65a6d9 local_48;
  LeftoverBuffer local_40;
  LogMessageFatal local_38;
  int iVar4;
  
  local_48.leftover = &local_40;
  local_40.size = 0;
  s = BytesAvailable(this,ptr);
  pcVar3 = (char *)0x0;
  do {
    iVar4 = (int)size;
    s_00 = iVar4 - s;
    size = (size_t)s_00;
    if (s_00 == 0 || iVar4 < s) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                 ,0x1ab,"size > chunk_size");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_38);
    }
    pcVar5 = pcVar3;
    if (this->next_chunk_ == (char *)0x0) goto LAB_0029f6da;
    bVar1 = VerifyUTF8Fallback::anon_class_8_1_4e65a6d9::operator()(&local_48,ptr,s);
    if ((!bVar1) || (this->limit_ < 0x11)) goto LAB_0029f6da;
    pcVar2 = Next(this);
    pcVar5 = (char *)0x0;
    if (pcVar2 == (char *)0x0) goto LAB_0029f6da;
    ptr = pcVar2 + 0x10;
    s = BytesAvailable(this,ptr);
  } while (s < (int)s_00);
  bVar1 = VerifyUTF8Fallback::anon_class_8_1_4e65a6d9::operator()(&local_48,ptr,s_00);
  if (bVar1) {
    pcVar5 = ptr + (int)s_00;
  }
  else {
    pcVar5 = (char *)0x0;
  }
LAB_0029f6da:
  pcVar3 = (char *)0x0;
  if (local_40.size == 0) {
    pcVar3 = pcVar5;
  }
  return pcVar3;
}

Assistant:

const char* EpsCopyInputStream::VerifyUTF8Fallback(const char* ptr,
                                                   size_t size) {
  // Copied the implementation of CordIsValid().
  LeftoverBuffer leftover;

  ptr = AppendSize(ptr, size, [&leftover](const char* p, int s) -> bool {
    return IsViewValidUTF8WithLeftover({p, static_cast<size_t>(s)}, leftover);
  });
  return leftover.empty() ? ptr : nullptr;
}